

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O1

vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> * __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::getSampleArgs
          (vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           *__return_storage_ptr__,Generator *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong local_128;
  float local_120 [2];
  undefined1 local_118 [68];
  undefined8 uStack_d4;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  value_type local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_testCase->m_useDerivatives == false) {
    if (((this->m_testCase->m_dimensions).m_data[0] & 0x40000000) == 0) {
      local_128 = 0;
      do {
        if ((*(byte *)((long)(this->m_testCase->m_dimensions).m_data + 7) & 0x40) == 0) {
          local_120[0] = (float)(int)local_128;
          iVar2 = 0;
          do {
            local_120[1] = (float)iVar2;
            lVar3 = 0;
            do {
              local_118._32_4_ = 0.0;
              local_118._36_4_ = 0.0;
              local_118._40_4_ = 0.0;
              local_118._44_4_ = 0.0;
              local_118._16_4_ = 0.0;
              local_118._20_4_ = 0.0;
              local_118._24_4_ = 0.0;
              local_118._28_4_ = 0.0;
              local_118._4_4_ =
                   local_120[1] / (float)((this->m_testCase->m_dimensions).m_data[1] * 2);
              local_118._0_4_ =
                   local_120[0] / (float)((this->m_testCase->m_dimensions).m_data[0] * 2);
              local_118._8_4_ = 0.0;
              local_118._12_4_ = 0.0;
              local_118._52_4_ = *(float *)((long)&DAT_00b82d00 + lVar3);
              std::
              vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
              ::push_back(__return_storage_ptr__,(value_type *)local_118);
              lVar3 = lVar3 + 4;
            } while (lVar3 != 0x1c);
            bVar1 = iVar2 < (this->m_testCase->m_dimensions).m_data[1] * 2;
            iVar2 = iVar2 + 1;
          } while (bVar1);
        }
        iVar2 = (int)local_128;
        local_128 = (ulong)(iVar2 + 1);
      } while (iVar2 < (this->m_testCase->m_dimensions).m_data[0] * 2);
    }
  }
  else {
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 0.0;
    local_118._24_4_ = 0.0;
    local_118._28_4_ = 0.0;
    local_118._0_4_ = 0.0;
    local_118._4_4_ = 0.0;
    local_118._8_4_ = 0.0;
    local_118._12_4_ = 0.0;
    local_118._32_4_ = 1.0;
    local_118._36_4_ = 1.0;
    local_118._40_4_ = 1.0;
    local_118._44_4_ = 0.0;
    local_118._48_4_ = 1.0;
    local_118._52_4_ = 1.0;
    local_118._56_4_ = 1.0;
    local_118._60_8_ = 0;
    uStack_d4 = 0;
    local_cc = 0;
    local_c8 = 0x3f8000003f800000;
    uStack_c0 = 0x3f800000;
    local_b8 = 0x3f8000003f800000;
    local_b0 = 0x3f800000;
    local_ac = 0;
    uStack_a4 = 0;
    local_128 = 0;
    local_9c = 0;
    local_98 = 0x40000000;
    uStack_94 = 0x40000000;
    uStack_90 = 0x40000000;
    uStack_8c = 0;
    local_88 = 0x40000000;
    uStack_84 = 0x40000000;
    uStack_80 = 0x40000000;
    uStack_7c = 0;
    if (((this->m_testCase->m_dimensions).m_data[0] & 0x40000000) == 0) {
      do {
        if ((*(byte *)((long)(this->m_testCase->m_dimensions).m_data + 7) & 0x40) == 0) {
          local_120[0] = (float)(int)local_128;
          iVar2 = 0;
          do {
            local_120[1] = (float)iVar2;
            lVar3 = 0x10;
            do {
              local_78.dPdx.m_data[0] = 0.0;
              local_78.dPdx.m_data[1] = 0.0;
              local_78.coord.m_data[1] =
                   local_120[1] / (float)((this->m_testCase->m_dimensions).m_data[1] * 2);
              local_78.coord.m_data[0] =
                   local_120[0] / (float)((this->m_testCase->m_dimensions).m_data[0] * 2);
              local_78.coord.m_data[2] = 0.0;
              local_78.coord.m_data[3] = 0.0;
              local_78.dPdx.m_data._8_8_ = *(undefined8 *)((long)local_120 + lVar3);
              local_78.dPdx.m_data._0_8_ = *(undefined8 *)((long)&local_128 + lVar3);
              local_78.dPdy.m_data._0_8_ = *(undefined8 *)(local_118 + lVar3);
              local_78.dPdy.m_data._8_8_ = *(undefined8 *)(local_118 + lVar3 + 8);
              std::
              vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
              ::push_back(__return_storage_ptr__,&local_78);
              lVar3 = lVar3 + 0x20;
            } while (lVar3 != 0xb0);
            bVar1 = iVar2 < (this->m_testCase->m_dimensions).m_data[1] * 2;
            iVar2 = iVar2 + 1;
          } while (bVar1);
        }
        iVar2 = (int)local_128;
        local_128 = (ulong)(iVar2 + 1);
      } while (iVar2 < (this->m_testCase->m_dimensions).m_data[0] * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<SampleArguments> getSampleArgs (void) const
	{
		std::vector<SampleArguments> args;

		if (m_testCase->m_useDerivatives)
		{
			struct
			{
				Vec4 dPdx;
				Vec4 dPdy;
			}
			derivativePairs[] =
			{
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(2.0f, 2.0f, 2.0f, 0.0f), Vec4(2.0f, 2.0f, 2.0f, 0.0f)}
			};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
				    for (deUint32 derivNdx = 0; derivNdx < DE_LENGTH_OF_ARRAY(derivativePairs); ++derivNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.dPdx = derivativePairs[derivNdx].dPdx;
						cur.dPdy = derivativePairs[derivNdx].dPdy;

						args.push_back(cur);
					}
				}
			}
		}
		else
		{
			const float lodList[] = {-1.0, -0.5, 0.0, 0.5, 1.0, 1.5, 2.0};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
					for (deUint32 lodNdx = 0; lodNdx < DE_LENGTH_OF_ARRAY(lodList); ++lodNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.lod = lodList[lodNdx];

						args.push_back(cur);
					}
				}
			}
		}

		return args;
	}